

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O1

void __thiscall helics::FilterFederate::processFilterReturn(FilterFederate *this,ActionMessage *cmd)

{
  atomic<int> *paVar1;
  uint32_t pid;
  uint32_t pid_00;
  GlobalFederateId fid;
  _Base_ptr p_Var2;
  bool bVar3;
  InterfaceHandle IVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  FilterCoordinator *pFVar7;
  pointer ppFVar8;
  bool bVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  pair<helics::ActionMessage_&,_bool> pVar12;
  BaseType fid_index;
  BaseType local_3c;
  BasicHandleInfo *local_38;
  
  local_38 = HandleManager::getInterfaceHandle
                       (this->mHandles,(InterfaceHandle)(cmd->dest_handle).hid,ENDPOINT);
  if (local_38 != (BasicHandleInfo *)0x0) {
    pid_00 = cmd->sequenceID;
    fid.gid = (local_38->handle).fed_id.gid;
    local_3c = fid.gid;
    pmVar5 = std::
             map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](&this->ongoingFilterProcesses,&local_3c);
    p_Var10 = &(pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var6 = p_Var10;
    for (p_Var2 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < (int)pid_00]
        ) {
      if ((int)pid_00 <= (int)p_Var2[1]._M_color) {
        p_Var6 = p_Var2;
      }
    }
    if ((p_Var6 != p_Var10) && ((int)p_Var6[1]._M_color <= (int)pid_00)) {
      p_Var10 = p_Var6;
    }
    pmVar5 = std::
             map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](&this->ongoingFilterProcesses,&local_3c);
    if ((_Rb_tree_header *)p_Var10 != &(pmVar5->_M_t)._M_impl.super__Rb_tree_header) {
      if (cmd->messageAction == cmd_null_message) {
        acceptProcessReturn(this,fid,pid_00);
      }
      else {
        pFVar7 = getFilterCoordinator(this,(InterfaceHandle)(local_38->handle).handle.hid);
        ActionMessage::setAction(cmd,cmd_send_message);
        uVar11 = (ulong)cmd->counter + 1;
        ppFVar8 = (pFVar7->sourceFilters).
                  super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (uVar11 < (ulong)((long)(pFVar7->sourceFilters).
                                   super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8 >> 3))
        {
          bVar9 = true;
          do {
            bVar3 = false;
            if ((ppFVar8[uVar11]->flags & 0x1000) == 0) {
              pVar12 = executeFilter(this,cmd,ppFVar8[uVar11]);
              bVar3 = false;
              if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                bVar3 = true;
                if (cmd->messageAction == cmd_ignore) {
                  bVar9 = false;
                }
                else if (uVar11 < ((long)(pFVar7->sourceFilters).
                                         super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pFVar7->sourceFilters).
                                         super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
                  cmd->counter = (uint16_t)uVar11;
                  ActionMessage::setAction(cmd,cmd_send_for_filter_return);
                  LOCK();
                  paVar1 = &this->messageCounter;
                  pid = (paVar1->super___atomic_base<int>)._M_i;
                  (paVar1->super___atomic_base<int>)._M_i =
                       (paVar1->super___atomic_base<int>)._M_i + 1;
                  UNLOCK();
                  cmd->sequenceID = pid;
                  IVar4.hid = (local_38->handle).handle.hid;
                  cmd->source_id = (GlobalFederateId)(local_38->handle).fed_id.gid;
                  cmd->source_handle = (InterfaceHandle)IVar4.hid;
                  generateProcessMarker
                            (this,(GlobalFederateId)(local_38->handle).fed_id.gid,pid,
                             (Time)(cmd->actionTime).internalTimeCode);
                }
                else {
                  ActionMessage::setAction(cmd,cmd_send_for_filter);
                }
              }
            }
            if (bVar3) break;
            uVar11 = uVar11 + 1;
            ppFVar8 = (pFVar7->sourceFilters).
                      super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar11 < (ulong)((long)(pFVar7->sourceFilters).
                                          super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8
                                   >> 3));
          acceptProcessReturn(this,fid,pid_00);
          if (!bVar9) {
            return;
          }
        }
        else {
          acceptProcessReturn(this,fid,pid_00);
        }
        if ((this->mDeliverMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->mDeliverMessage)._M_invoker)((_Any_data *)&this->mDeliverMessage,cmd);
      }
    }
  }
  return;
}

Assistant:

void FilterFederate::processFilterReturn(ActionMessage& cmd)
{
    auto* handle = mHandles->getInterfaceHandle(cmd.dest_handle, InterfaceType::ENDPOINT);
    if (handle == nullptr) {
        return;
    }

    auto mid = cmd.sequenceID;
    auto fid = handle->getFederateId();
    auto fid_index = fid.baseValue();

    if (ongoingFilterProcesses[fid_index].find(mid) != ongoingFilterProcesses[fid_index].end()) {
        if (cmd.action() == CMD_NULL_MESSAGE) {
            acceptProcessReturn(fid, mid);
            return;
        }
        auto* filtFunc = getFilterCoordinator(handle->getInterfaceHandle());
        cmd.setAction(CMD_SEND_MESSAGE);
        bool needToSendMessage{true};
        for (auto ii = static_cast<size_t>(cmd.counter) + 1; ii < filtFunc->sourceFilters.size();
             ++ii) {
            auto* filt = filtFunc->sourceFilters[ii];
            if (checkActionFlag(*filt, disconnected_flag)) {
                continue;
            }

            auto press = executeFilter(cmd, filt);
            if (!press.second) {
                if (cmd.action() == CMD_IGNORE) {
                    needToSendMessage = false;
                    break;
                }

                if (ii < filtFunc->sourceFilters.size() - 1) {
                    cmd.counter = static_cast<uint16_t>(ii);
                    cmd.setAction(CMD_SEND_FOR_FILTER_AND_RETURN);
                    cmd.sequenceID = messageCounter++;
                    cmd.setSource(handle->handle);
                    generateProcessMarker(handle->getFederateId(), cmd.sequenceID, cmd.actionTime);
                } else {
                    cmd.setAction(CMD_SEND_FOR_FILTER);
                }
                break;
            }
        }
        acceptProcessReturn(fid, mid);
        if (needToSendMessage) {
            mDeliverMessage(cmd);
        }
    }
}